

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::SpecparamSymbol::resolvePathTerminal
          (SpecparamSymbol *this,string_view terminalName,Scope *parent,SourceLocation loc,
          bool isSource)

{
  Type *type;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  SpecifyBlockSymbol *this_00;
  ValueSymbol *terminal;
  Diagnostic *pDVar2;
  SourceLocation SVar3;
  LookupLocation location;
  LookupLocation LVar4;
  SourceRange sourceRange_01;
  SourceLocation SVar5;
  SourceLocation SVar6;
  
  type = (Type *)parent->thisSym->parentScope;
  SVar3 = (SourceLocation)(terminalName._M_len * 0x10000000 + (long)loc);
  LVar4 = LookupLocation::after(parent->thisSym);
  sourceRange.endLoc = SVar3;
  sourceRange.startLoc = loc;
  location._12_4_ = 0;
  location.scope = (Scope *)SUB128(LVar4._0_12_,0);
  location.index = SUB124(LVar4._0_12_,8);
  SVar5 = loc;
  SVar6 = SVar3;
  this_00 = (SpecifyBlockSymbol *)
            Lookup::unqualifiedAt
                      ((Scope *)type,terminalName,location,sourceRange,
                       (bitmask<slang::ast::LookupFlags>)0x40);
  if (this_00 != (SpecifyBlockSymbol *)0x0) {
    bVar1 = Symbol::isValue((Symbol *)this_00);
    if (bVar1) {
      terminal = (ValueSymbol *)DeclaredType::getType((DeclaredType *)&this_00->super_Scope);
      sourceRange_00.endLoc = SVar6;
      sourceRange_00.startLoc = SVar5;
      bVar1 = SpecifyBlockSymbol::checkPathTerminal
                        (this_00,terminal,type,(Scope *)(ulong)!isSource,loc._0_4_,sourceRange_00);
      if (!bVar1) {
        return (Symbol *)0x0;
      }
      return &this_00->super_Symbol;
    }
    sourceRange_01.endLoc = SVar3;
    sourceRange_01.startLoc = loc;
    pDVar2 = Scope::addDiag(parent,(DiagCode)((uint)isSource * 0x20000 + 0x630006),sourceRange_01);
    pDVar2 = Diagnostic::operator<<(pDVar2,terminalName);
    Diagnostic::addNote(pDVar2,(DiagCode)0x50001,(this_00->super_Symbol).location);
  }
  return (Symbol *)0x0;
}

Assistant:

const Symbol* SpecparamSymbol::resolvePathTerminal(std::string_view terminalName,
                                                   const Scope& parent, SourceLocation loc,
                                                   bool isSource) const {
    auto parentParent = parent.asSymbol().getParentScope();
    SLANG_ASSERT(parentParent);

    SourceRange sourceRange{loc, loc + terminalName.length()};
    auto symbol = Lookup::unqualifiedAt(*parentParent, terminalName,
                                        LookupLocation::after(parent.asSymbol()), sourceRange,
                                        LookupFlags::NoParentScope);
    if (!symbol)
        return nullptr;

    if (!symbol->isValue()) {
        auto code = isSource ? diag::InvalidSpecifySource : diag::InvalidSpecifyDest;
        auto& diag = parent.addDiag(code, sourceRange) << terminalName;
        diag.addNote(diag::NoteDeclarationHere, symbol->location);
        return nullptr;
    }

    auto dir = isSource ? SpecifyBlockSymbol::SpecifyTerminalDir::Input
                        : SpecifyBlockSymbol::SpecifyTerminalDir::Output;
    auto& value = symbol->as<ValueSymbol>();
    if (!SpecifyBlockSymbol::checkPathTerminal(value, value.getType(), *parentParent, dir,
                                               sourceRange)) {
        return nullptr;
    }

    return symbol;
}